

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O0

int little2_scanComment(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char *pcVar1;
  uint local_34;
  char **nextTokPtr_local;
  char *end_local;
  char *ptr_local;
  ENCODING *enc_local;
  
  if (1 < (long)end - (long)ptr) {
    if ((ptr[1] != '\0') || (*ptr != '-')) {
      *nextTokPtr = ptr;
      return 0;
    }
    pcVar1 = ptr + 2;
    while (end_local = pcVar1, 1 < (long)end - (long)end_local) {
      if (end_local[1] == '\0') {
        local_34 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*end_local);
      }
      else {
        local_34 = unicode_byte_type(end_local[1],*end_local);
      }
      switch(local_34) {
      case 0:
      case 1:
      case 8:
        *nextTokPtr = end_local;
        return 0;
      default:
        pcVar1 = end_local + 2;
        break;
      case 5:
        if ((long)end - (long)end_local < 2) {
          return -2;
        }
        pcVar1 = end_local + 2;
        break;
      case 6:
        if ((long)end - (long)end_local < 3) {
          return -2;
        }
        pcVar1 = end_local + 3;
        break;
      case 7:
        if ((long)end - (long)end_local < 4) {
          return -2;
        }
        pcVar1 = end_local + 4;
        break;
      case 0x1b:
        pcVar1 = end_local + 2;
        if ((long)end - (long)pcVar1 < 2) {
          return -1;
        }
        if ((end_local[3] == '\0') && (*pcVar1 == '-')) {
          pcVar1 = end_local + 4;
          if ((long)end - (long)pcVar1 < 2) {
            return -1;
          }
          if ((end_local[5] == '\0') && (*pcVar1 == '>')) {
            *nextTokPtr = end_local + 6;
            return 0xd;
          }
          *nextTokPtr = pcVar1;
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int PTRCALL
PREFIX(scanComment)(const ENCODING *enc, const char *ptr,
                    const char *end, const char **nextTokPtr)
{
  if (HAS_CHAR(enc, ptr, end)) {
    if (!CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
    ptr += MINBPC(enc);
    while (HAS_CHAR(enc, ptr, end)) {
      switch (BYTE_TYPE(enc, ptr)) {
      INVALID_CASES(ptr, nextTokPtr)
      case BT_MINUS:
        ptr += MINBPC(enc);
        REQUIRE_CHAR(enc, ptr, end);
        if (CHAR_MATCHES(enc, ptr, ASCII_MINUS)) {
          ptr += MINBPC(enc);
          REQUIRE_CHAR(enc, ptr, end);
          if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr;
            return XML_TOK_INVALID;
          }
          *nextTokPtr = ptr + MINBPC(enc);
          return XML_TOK_COMMENT;
        }
        break;
      default:
        ptr += MINBPC(enc);
        break;
      }
    }
  }
  return XML_TOK_PARTIAL;
}